

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

void __thiscall
duckdb::FilterCombiner::GenerateFilters
          (FilterCombiner *this,
          function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)>
          *callback)

{
  pointer puVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Base_ptr p_Var3;
  _Base_ptr *this_00;
  reference pvVar4;
  BoundComparisonExpression *pBVar5;
  reference pvVar6;
  BoundConstantExpression *pBVar7;
  idx_t iVar8;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr p_Var10;
  ulong uVar11;
  _Any_data *p_Var12;
  pointer *__ptr_1;
  pointer *__ptr;
  pointer puVar13;
  size_type __n;
  pointer puVar14;
  templated_unique_single_t lower_constant;
  bool upper_inclusive;
  bool lower_inclusive;
  templated_unique_single_t upper_constant;
  optional_idx upper_index;
  optional_idx lower_index;
  templated_unique_single_t between;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_118;
  bool local_10a;
  bool local_109;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_108;
  optional_idx local_100;
  optional_idx local_f8;
  _Base_ptr *local_f0;
  _Any_data *local_e8;
  _Base_ptr *local_e0;
  size_type local_d8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_d0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_c8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_c0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_b8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_b0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_a8;
  _Base_ptr local_a0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_98;
  BoundConstantExpression *local_90 [8];
  _Base_ptr local_50;
  FilterCombiner *local_48;
  _Rb_tree_node_base *local_40;
  ulong local_38;
  
  puVar14 = (this->remaining_filters).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->remaining_filters).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = (_Any_data *)callback;
  if (puVar14 != puVar1) {
    do {
      local_a8._M_head_impl =
           (puVar14->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (puVar14->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      if (*(long *)(local_e8 + 1) == 0) {
        ::std::__throw_bad_function_call();
      }
      (**(code **)((long)local_e8 + 0x18))
                (local_e8,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_a8);
      if (local_a8._M_head_impl != (Expression *)0x0) {
        (*((local_a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_a8._M_head_impl = (Expression *)0x0;
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar1);
  }
  puVar14 = (this->remaining_filters).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->remaining_filters).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar13 = puVar14;
  if (puVar1 != puVar14) {
    do {
      _Var2._M_head_impl =
           (puVar13->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      if (_Var2._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
      }
      (puVar13->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar1);
    (this->remaining_filters).
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar14;
  }
  p_Var9 = (this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_40) {
    local_50 = &(this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var12 = local_e8;
    local_48 = this;
    do {
      uVar11 = *(ulong *)(p_Var9 + 1);
      p_Var10 = local_50;
      for (p_Var3 = (local_48->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent; p_Var3 != (_Base_ptr)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < uVar11]) {
        if (*(ulong *)(p_Var3 + 1) >= uVar11) {
          p_Var10 = p_Var3;
        }
      }
      local_a0 = local_50;
      if ((p_Var10 != local_50) && (local_a0 = p_Var10, uVar11 < *(ulong *)(p_Var10 + 1))) {
        local_a0 = local_50;
      }
      if (p_Var9[1]._M_left != p_Var9[1]._M_parent) {
        local_e0 = &p_Var9[1]._M_parent;
        local_f0 = &local_a0[1]._M_parent;
        local_38 = 0;
        do {
          uVar11 = local_38 + 1;
          local_d8 = local_38;
          local_38 = uVar11;
          if (uVar11 < (ulong)((long)p_Var9[1]._M_left - (long)p_Var9[1]._M_parent >> 3)) {
            do {
              this_00 = local_e0;
              pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                                 ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                                  local_e0,local_d8);
              (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_f8);
              pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                                 ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                                  this_00,uVar11);
              (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_100);
              pBVar5 = (BoundComparisonExpression *)operator_new(0x68);
              local_90[0] = (BoundConstantExpression *)local_f8.index;
              local_f8.index = 0;
              local_118._M_head_impl = (Expression *)local_100.index;
              local_100.index = 0;
              BoundComparisonExpression::BoundComparisonExpression
                        (pBVar5,COMPARE_BOUNDARY_START,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_90,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&local_118);
              if ((BoundConstantExpression *)local_118._M_head_impl !=
                  (BoundConstantExpression *)0x0) {
                (*(((Expression *)&(local_118._M_head_impl)->super_BaseExpression)->
                  super_BaseExpression)._vptr_BaseExpression[1])();
              }
              local_118._M_head_impl = (Expression *)0x0;
              if (local_90[0] != (BoundConstantExpression *)0x0) {
                (*(local_90[0]->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
              }
              if ((BoundConstantExpression *)local_100.index != (BoundConstantExpression *)0x0) {
                (**(code **)(*(long *)local_100.index + 8))();
              }
              if ((BoundConstantExpression *)local_f8.index != (BoundConstantExpression *)0x0) {
                (**(code **)(*(long *)local_f8.index + 8))();
              }
              local_b0._M_head_impl = (Expression *)pBVar5;
              if (*(long *)(p_Var12 + 1) == 0) {
                ::std::__throw_bad_function_call();
              }
              (**(code **)((long)p_Var12 + 0x18))
                        (p_Var12,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                  *)&local_b0);
              if ((BoundComparisonExpression *)local_b0._M_head_impl !=
                  (BoundComparisonExpression *)0x0) {
                (*(((Expression *)&(local_b0._M_head_impl)->super_BaseExpression)->
                  super_BaseExpression)._vptr_BaseExpression[1])();
              }
              local_b0._M_head_impl = (Expression *)0x0;
              uVar11 = uVar11 + 1;
            } while (uVar11 < (ulong)((long)p_Var9[1]._M_left - (long)p_Var9[1]._M_parent >> 3));
          }
          local_f8.index = 0xffffffffffffffff;
          local_100.index = 0xffffffffffffffff;
          local_109 = false;
          local_10a = false;
          if (local_a0[1]._M_left != local_a0[1]._M_parent) {
            __n = 0;
            do {
              pvVar6 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::operator[]
                                 ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                   *)local_f0,__n);
              switch(pvVar6->comparison_type) {
              case COMPARE_LESSTHAN:
              case COMPARE_LESSTHANOREQUALTO:
                optional_idx::optional_idx((optional_idx *)local_90,__n);
                local_100.index = (idx_t)local_90[0];
                local_10a = pvVar6->comparison_type == COMPARE_LESSTHANOREQUALTO;
                break;
              case COMPARE_GREATERTHAN:
              case COMPARE_GREATERTHANOREQUALTO:
                optional_idx::optional_idx((optional_idx *)local_90,__n);
                local_f8.index = (idx_t)local_90[0];
                local_109 = pvVar6->comparison_type == COMPARE_GREATERTHANOREQUALTO;
                break;
              default:
                pBVar7 = (BoundConstantExpression *)operator_new(0x98);
                Value::Value((Value *)local_90,&pvVar6->constant);
                BoundConstantExpression::BoundConstantExpression(pBVar7,(Value *)local_90);
                Value::~Value((Value *)local_90);
                pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                                   ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                                    local_e0,local_d8);
                (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_108);
                pBVar5 = (BoundComparisonExpression *)operator_new(0x68);
                local_90[0] = local_108._M_head_impl;
                local_108._M_head_impl = (BoundConstantExpression *)0x0;
                local_118._M_head_impl = (Expression *)pBVar7;
                BoundComparisonExpression::BoundComparisonExpression
                          (pBVar5,pvVar6->comparison_type,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_90,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_118);
                if ((BoundConstantExpression *)local_118._M_head_impl !=
                    (BoundConstantExpression *)0x0) {
                  (*(((Expression *)&(local_118._M_head_impl)->super_BaseExpression)->
                    super_BaseExpression)._vptr_BaseExpression[1])();
                }
                local_118._M_head_impl = (Expression *)0x0;
                if (local_90[0] != (BoundConstantExpression *)0x0) {
                  (*(local_90[0]->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
                }
                if (local_108._M_head_impl != (BoundConstantExpression *)0x0) {
                  (*((local_108._M_head_impl)->super_Expression).super_BaseExpression.
                    _vptr_BaseExpression[1])();
                }
                p_Var12 = local_e8;
                local_b8._M_head_impl = (Expression *)pBVar5;
                if (*(long *)(local_e8 + 1) == 0) {
                  ::std::__throw_bad_function_call();
                }
                (**(code **)((long)local_e8 + 0x18))
                          (local_e8,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                     *)&local_b8);
                if ((BoundComparisonExpression *)local_b8._M_head_impl !=
                    (BoundComparisonExpression *)0x0) {
                  (*(((Expression *)&(local_b8._M_head_impl)->super_BaseExpression)->
                    super_BaseExpression)._vptr_BaseExpression[1])();
                }
                local_b8._M_head_impl = (Expression *)0x0;
              }
              __n = __n + 1;
            } while (__n < (ulong)(((long)local_a0[1]._M_left - (long)local_a0[1]._M_parent >> 3) *
                                  -0x71c71c71c71c71c7));
          }
          if (((BoundConstantExpression *)local_f8.index ==
               (BoundConstantExpression *)0xffffffffffffffff) ||
             ((BoundConstantExpression *)local_100.index ==
              (BoundConstantExpression *)0xffffffffffffffff)) {
            if ((BoundConstantExpression *)local_f8.index ==
                (BoundConstantExpression *)0xffffffffffffffff) {
              if ((BoundConstantExpression *)local_100.index !=
                  (BoundConstantExpression *)0xffffffffffffffff) {
                iVar8 = optional_idx::GetIndex(&local_100);
                pvVar6 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::
                         operator[]((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                     *)local_f0,iVar8);
                pBVar7 = (BoundConstantExpression *)operator_new(0x98);
                Value::Value((Value *)local_90,&pvVar6->constant);
                BoundConstantExpression::BoundConstantExpression(pBVar7,(Value *)local_90);
                Value::~Value((Value *)local_90);
                iVar8 = optional_idx::GetIndex(&local_100);
                pvVar6 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::
                         operator[]((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                     *)local_f0,iVar8);
                pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                                   ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                                    local_e0,local_d8);
                (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_108);
                pBVar5 = (BoundComparisonExpression *)operator_new(0x68);
                local_90[0] = local_108._M_head_impl;
                local_108._M_head_impl = (BoundConstantExpression *)0x0;
                local_118._M_head_impl = (Expression *)pBVar7;
                BoundComparisonExpression::BoundComparisonExpression
                          (pBVar5,pvVar6->comparison_type,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_90,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_118);
                p_Var12 = local_e8;
                if ((BoundConstantExpression *)local_118._M_head_impl !=
                    (BoundConstantExpression *)0x0) {
                  (*(((Expression *)&(local_118._M_head_impl)->super_BaseExpression)->
                    super_BaseExpression)._vptr_BaseExpression[1])();
                }
                local_118._M_head_impl = (Expression *)0x0;
                if (local_90[0] != (BoundConstantExpression *)0x0) {
                  (*(local_90[0]->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
                }
                if (local_108._M_head_impl != (BoundConstantExpression *)0x0) {
                  (*((local_108._M_head_impl)->super_Expression).super_BaseExpression.
                    _vptr_BaseExpression[1])();
                }
                local_d0._M_head_impl = (Expression *)pBVar5;
                if (*(long *)(p_Var12 + 1) == 0) {
                  ::std::__throw_bad_function_call();
                }
                (**(code **)((long)p_Var12 + 0x18))
                          (p_Var12,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)&local_d0);
                if ((BoundComparisonExpression *)local_d0._M_head_impl !=
                    (BoundComparisonExpression *)0x0) {
                  (*(((Expression *)&(local_d0._M_head_impl)->super_BaseExpression)->
                    super_BaseExpression)._vptr_BaseExpression[1])();
                }
                local_d0._M_head_impl = (Expression *)0x0;
              }
            }
            else {
              iVar8 = optional_idx::GetIndex(&local_f8);
              pvVar6 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::operator[]
                                 ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                   *)local_f0,iVar8);
              pBVar7 = (BoundConstantExpression *)operator_new(0x98);
              Value::Value((Value *)local_90,&pvVar6->constant);
              BoundConstantExpression::BoundConstantExpression(pBVar7,(Value *)local_90);
              Value::~Value((Value *)local_90);
              iVar8 = optional_idx::GetIndex(&local_f8);
              pvVar6 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::operator[]
                                 ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                   *)local_f0,iVar8);
              pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                                 ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                                  local_e0,local_d8);
              (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_108);
              pBVar5 = (BoundComparisonExpression *)operator_new(0x68);
              local_90[0] = local_108._M_head_impl;
              local_108._M_head_impl = (BoundConstantExpression *)0x0;
              local_118._M_head_impl = (Expression *)pBVar7;
              BoundComparisonExpression::BoundComparisonExpression
                        (pBVar5,pvVar6->comparison_type,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_90,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&local_118);
              p_Var12 = local_e8;
              if ((BoundConstantExpression *)local_118._M_head_impl !=
                  (BoundConstantExpression *)0x0) {
                (*(((Expression *)&(local_118._M_head_impl)->super_BaseExpression)->
                  super_BaseExpression)._vptr_BaseExpression[1])();
              }
              local_118._M_head_impl = (Expression *)0x0;
              if (local_90[0] != (BoundConstantExpression *)0x0) {
                (*(local_90[0]->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
              }
              if (local_108._M_head_impl != (BoundConstantExpression *)0x0) {
                (*((local_108._M_head_impl)->super_Expression).super_BaseExpression.
                  _vptr_BaseExpression[1])();
              }
              local_c8._M_head_impl = (Expression *)pBVar5;
              if (*(long *)(p_Var12 + 1) == 0) {
                ::std::__throw_bad_function_call();
              }
              (**(code **)((long)p_Var12 + 0x18))
                        (p_Var12,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                  *)&local_c8);
              if ((BoundComparisonExpression *)local_c8._M_head_impl !=
                  (BoundComparisonExpression *)0x0) {
                (*(((Expression *)&(local_c8._M_head_impl)->super_BaseExpression)->
                  super_BaseExpression)._vptr_BaseExpression[1])();
              }
              local_c8._M_head_impl = (Expression *)0x0;
            }
          }
          else {
            iVar8 = optional_idx::GetIndex(&local_f8);
            pvVar6 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::operator[]
                               ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *)
                                local_f0,iVar8);
            pBVar7 = (BoundConstantExpression *)operator_new(0x98);
            Value::Value((Value *)local_90,&pvVar6->constant);
            BoundConstantExpression::BoundConstantExpression(pBVar7,(Value *)local_90);
            local_118._M_head_impl = (Expression *)pBVar7;
            Value::~Value((Value *)local_90);
            iVar8 = optional_idx::GetIndex(&local_100);
            pvVar6 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::operator[]
                               ((vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *)
                                local_f0,iVar8);
            pBVar7 = (BoundConstantExpression *)operator_new(0x98);
            Value::Value((Value *)local_90,&pvVar6->constant);
            BoundConstantExpression::BoundConstantExpression(pBVar7,(Value *)local_90);
            local_108._M_head_impl = pBVar7;
            Value::~Value((Value *)local_90);
            pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                               ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)local_e0
                                ,local_d8);
            (*(pvVar4->_M_data->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_98);
            make_uniq<duckdb::BoundBetweenExpression,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>,bool&,bool&>
                      ((duckdb *)local_90,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_98,
                       (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                        *)&local_118,
                       (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                        *)&local_108,&local_109,&local_10a);
            if (local_98._M_head_impl != (Expression *)0x0) {
              (*((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_c0._M_head_impl = &local_90[0]->super_Expression;
            p_Var12 = local_e8;
            local_90[0] = (BoundConstantExpression *)0x0;
            if (*(long *)(local_e8 + 1) == 0) {
              ::std::__throw_bad_function_call();
            }
            (**(code **)((long)local_e8 + 0x18))
                      (local_e8,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                 *)&local_c0);
            if ((BoundConstantExpression *)local_c0._M_head_impl != (BoundConstantExpression *)0x0)
            {
              (*(((Expression *)&(local_c0._M_head_impl)->super_BaseExpression)->
                super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_c0._M_head_impl = (Expression *)0x0;
            if (local_90[0] != (BoundConstantExpression *)0x0) {
              (*(local_90[0]->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
            }
            if (local_108._M_head_impl != (BoundConstantExpression *)0x0) {
              (*((local_108._M_head_impl)->super_Expression).super_BaseExpression.
                _vptr_BaseExpression[1])();
            }
            if ((BoundConstantExpression *)local_118._M_head_impl != (BoundConstantExpression *)0x0)
            {
              (*(((Expression *)&(local_118._M_head_impl)->super_BaseExpression)->
                super_BaseExpression)._vptr_BaseExpression[1])();
            }
          }
        } while (local_38 < (ulong)((long)p_Var9[1]._M_left - (long)p_Var9[1]._M_parent >> 3));
      }
      p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9);
      this = local_48;
    } while (p_Var9 != local_40);
  }
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->stored_expressions)._M_h);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->equivalence_set_map)._M_h);
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
  ::clear(&(this->constant_values)._M_t);
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
  ::clear(&(this->equivalence_map)._M_t);
  return;
}

Assistant:

void FilterCombiner::GenerateFilters(const std::function<void(unique_ptr<Expression> filter)> &callback) {
	// first loop over the remaining filters
	for (auto &filter : remaining_filters) {
		callback(std::move(filter));
	}
	remaining_filters.clear();
	// now loop over the equivalence sets
	for (auto &entry : equivalence_map) {
		auto equivalence_set = entry.first;
		auto &entries = entry.second;
		auto &constant_list = constant_values.find(equivalence_set)->second;
		// for each entry generate an equality expression comparing to each other
		for (idx_t i = 0; i < entries.size(); i++) {
			for (idx_t k = i + 1; k < entries.size(); k++) {
				auto comparison = make_uniq<BoundComparisonExpression>(
				    ExpressionType::COMPARE_EQUAL, entries[i].get().Copy(), entries[k].get().Copy());
				callback(std::move(comparison));
			}
			// for each entry also create a comparison with each constant
			auto lower_index = optional_idx::Invalid();
			auto upper_index = optional_idx::Invalid();
			bool lower_inclusive = false;
			bool upper_inclusive = false;
			for (idx_t k = 0; k < constant_list.size(); k++) {
				auto &info = constant_list[k];
				if (info.comparison_type == ExpressionType::COMPARE_GREATERTHAN ||
				    info.comparison_type == ExpressionType::COMPARE_GREATERTHANOREQUALTO) {
					lower_index = k;
					lower_inclusive = info.comparison_type == ExpressionType::COMPARE_GREATERTHANOREQUALTO;
				} else if (info.comparison_type == ExpressionType::COMPARE_LESSTHAN ||
				           info.comparison_type == ExpressionType::COMPARE_LESSTHANOREQUALTO) {
					upper_index = k;
					upper_inclusive = info.comparison_type == ExpressionType::COMPARE_LESSTHANOREQUALTO;
				} else {
					auto constant = make_uniq<BoundConstantExpression>(info.constant);
					auto comparison = make_uniq<BoundComparisonExpression>(
					    info.comparison_type, entries[i].get().Copy(), std::move(constant));
					callback(std::move(comparison));
				}
			}
			if (lower_index.IsValid() && upper_index.IsValid()) {
				// found both lower and upper index, create a BETWEEN expression
				auto lower_constant =
				    make_uniq<BoundConstantExpression>(constant_list[lower_index.GetIndex()].constant);
				auto upper_constant =
				    make_uniq<BoundConstantExpression>(constant_list[upper_index.GetIndex()].constant);
				auto between =
				    make_uniq<BoundBetweenExpression>(entries[i].get().Copy(), std::move(lower_constant),
				                                      std::move(upper_constant), lower_inclusive, upper_inclusive);
				callback(std::move(between));
			} else if (lower_index.IsValid()) {
				// only lower index found, create simple comparison expression
				auto constant = make_uniq<BoundConstantExpression>(constant_list[lower_index.GetIndex()].constant);
				auto comparison =
				    make_uniq<BoundComparisonExpression>(constant_list[lower_index.GetIndex()].comparison_type,
				                                         entries[i].get().Copy(), std::move(constant));
				callback(std::move(comparison));
			} else if (upper_index.IsValid()) {
				// only upper index found, create simple comparison expression
				auto constant = make_uniq<BoundConstantExpression>(constant_list[upper_index.GetIndex()].constant);
				auto comparison =
				    make_uniq<BoundComparisonExpression>(constant_list[upper_index.GetIndex()].comparison_type,
				                                         entries[i].get().Copy(), std::move(constant));
				callback(std::move(comparison));
			}
		}
	}
	stored_expressions.clear();
	equivalence_set_map.clear();
	constant_values.clear();
	equivalence_map.clear();
}